

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringbuilder.h
# Opt level: O3

QByteArray *
QtStringBuilder::appendToByteArray<QStringBuilder<char_const(&)[11],QByteArray>,char_const(&)[4]>
          (QByteArray *a,
          QStringBuilder<QStringBuilder<const_char_(&)[11],_QByteArray>,_const_char_(&)[4]> *b,
          char param_3)

{
  ArrayOptions *pAVar1;
  size_t __n;
  char (*pacVar2) [4];
  ulong uVar3;
  char *pcVar4;
  char cVar5;
  Data *pDVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  char *__dest;
  ulong uVar10;
  
  pDVar6 = (a->d).d;
  uVar8 = (a->d).size;
  uVar10 = uVar8 + (b->a).b.d.size + 0xd;
  if ((pDVar6 == (Data *)0x0) ||
     (1 < (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
    QByteArray::reallocData((longlong)a,(AllocationOption)uVar8);
    pDVar6 = (a->d).d;
    uVar8 = (a->d).size;
    uVar3 = uVar10;
    if (pDVar6 != (Data *)0x0) goto LAB_001aab14;
LAB_001aab51:
    if (uVar3 < uVar8) {
      uVar3 = uVar8;
    }
    QByteArray::reallocData((longlong)a,(AllocationOption)uVar3);
    pDVar6 = (a->d).d;
    if (pDVar6 != (Data *)0x0) {
      lVar7 = (pDVar6->super_QArrayData).alloc;
LAB_001aab74:
      if (lVar7 != 0) {
        pAVar1 = &(pDVar6->super_QArrayData).flags;
        *(byte *)&(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
                  super_QFlagsStorage<QArrayData::ArrayOption>.i =
             (byte)(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
                   super_QFlagsStorage<QArrayData::ArrayOption>.i | 1;
      }
      goto LAB_001aab7d;
    }
  }
  else {
LAB_001aab14:
    lVar7 = (pDVar6->super_QArrayData).alloc;
    pcVar4 = (a->d).ptr;
    lVar9 = ((ulong)((long)&pDVar6[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0) + lVar7;
    if ((long)((lVar9 - uVar8) - (long)pcVar4) < (long)uVar10) {
      uVar3 = lVar7 * 2;
      if (lVar7 * 2 < (long)uVar10) {
        uVar3 = uVar10;
      }
      if ((1 < (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i) ||
         (lVar9 - (long)pcVar4 < (long)uVar3)) goto LAB_001aab51;
      goto LAB_001aab74;
    }
LAB_001aab7d:
    if ((pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i < 2)
    goto LAB_001aab95;
  }
  QByteArray::reallocData((longlong)a,(AllocationOption)(a->d).size);
LAB_001aab95:
  __dest = (a->d).ptr + (a->d).size;
  pcVar4 = *(b->a).a;
  cVar5 = *pcVar4;
  while (cVar5 != '\0') {
    pcVar4 = pcVar4 + 1;
    *__dest = cVar5;
    __dest = __dest + 1;
    cVar5 = *pcVar4;
  }
  __n = (b->a).b.d.size;
  if (__n != 0) {
    memcpy(__dest,(b->a).b.d.ptr,__n);
  }
  pacVar2 = b->b;
  cVar5 = (*pacVar2)[0];
  if (cVar5 != '\0') {
    lVar7 = 0;
    do {
      __dest[lVar7 + __n] = cVar5;
      cVar5 = (*pacVar2)[lVar7 + 1];
      lVar7 = lVar7 + 1;
    } while (cVar5 != '\0');
  }
  QByteArray::resize((longlong)a);
  return a;
}

Assistant:

QByteArray &appendToByteArray(QByteArray &a, const QStringBuilder<A, B> &b, char)
{
    // append 8-bit data to a byte array
    qsizetype len = a.size() + QConcatenable< QStringBuilder<A, B> >::size(b);
    a.detach(); // a detach() in a.data() could reset a.capacity() to a.size()
    if (len > a.data_ptr().freeSpaceAtEnd()) // capacity() was broken when prepend()-optimization landed
        a.reserve(qMax(len, 2 * a.capacity()));
    char *it = a.data() + a.size();
    QConcatenable< QStringBuilder<A, B> >::appendTo(b, it);
    a.resize(len); //we need to resize after the appendTo for the case str+=foo+str
    return a;
}